

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

Ref __thiscall
wasm::Wasm2JSBuilder::processFunction
          (Wasm2JSBuilder *this,Module *m,Function *func,bool standaloneFunction)

{
  Wasm2JSBuilder *this_00;
  bool bVar1;
  Index IVar2;
  JsType type;
  size_type sVar3;
  size_t sVar4;
  Type TVar5;
  Ref *pRVar6;
  Value *this_01;
  Ref RVar7;
  Ref RVar8;
  int iVar9;
  undefined7 in_register_00000009;
  char *pcVar10;
  Function *pFVar11;
  void *pvVar12;
  Ref in_R8;
  Ref value;
  size_t in_R9;
  ulong uVar13;
  IString IVar14;
  Name NVar15;
  string_view sVar16;
  IString name;
  IString arg;
  IString op;
  IString name_00;
  uint in_stack_fffffffffffffd28;
  undefined **local_2d0;
  Ref theVar;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1e0;
  bool local_1c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1b8;
  bool local_198;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_190;
  bool local_170;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_168;
  bool local_148;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_140;
  bool local_120;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  Value *local_78;
  Ref local_70;
  size_t local_68;
  Module *local_60;
  Wasm2JSBuilder *local_58;
  JsType local_50;
  int local_4c;
  Function *local_48;
  size_t local_40;
  Ref local_38;
  Ref ret;
  
  iVar9 = (int)CONCAT71(in_register_00000009,standaloneFunction);
  local_48 = func;
  if (iVar9 != 0) {
    local_2d0 = &PTR__PassRunner_01091270;
    theVar.inst = (Value *)m;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"flatten","");
    local_1c0 = false;
    PassRunner::add((PassRunner *)&stack0xfffffffffffffd30,&local_118,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1e0);
    if (local_1c0 == true) {
      local_1c0 = false;
      if (local_1e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1e0._M_value + 0x10)) {
        operator_delete((void *)local_1e0._M_value._M_dataplus._M_p,local_1e0._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"simplify-locals-notee-nostructure","");
    local_198 = false;
    PassRunner::add((PassRunner *)&stack0xfffffffffffffd30,&local_f8,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1b8);
    if (local_198 == true) {
      local_198 = false;
      if (local_1b8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1b8._M_value + 0x10)) {
        operator_delete((void *)local_1b8._M_value._M_dataplus._M_p,local_1b8._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"reorder-locals","");
    local_170 = false;
    PassRunner::add((PassRunner *)&stack0xfffffffffffffd30,&local_d8,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_190);
    if (local_170 == true) {
      local_170 = false;
      if (local_190._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_190._M_value + 0x10)) {
        operator_delete((void *)local_190._M_value._M_dataplus._M_p,local_190._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"remove-unused-names","");
    local_148 = false;
    PassRunner::add((PassRunner *)&stack0xfffffffffffffd30,&local_b8,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_168);
    if (local_148 == true) {
      local_148 = false;
      if (local_168._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_168._M_value + 0x10)) {
        operator_delete((void *)local_168._M_value._M_dataplus._M_p,local_168._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"vacuum","");
    local_120 = false;
    PassRunner::add((PassRunner *)&stack0xfffffffffffffd30,&local_98,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_140);
    if (local_120 == true) {
      local_120 = false;
      if (local_140._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_140._M_value + 0x10)) {
        operator_delete((void *)local_140._M_value._M_dataplus._M_p,local_140._16_8_ + 1);
      }
    }
    func = local_48;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    PassRunner::runOnFunction((PassRunner *)&stack0xfffffffffffffd30,func);
    PassRunner::~PassRunner((PassRunner *)&stack0xfffffffffffffd30);
  }
  local_60 = m;
  std::
  _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->frees)._M_h);
  std::
  _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->temps)._M_h);
  Names::ensureNames(func);
  IVar14 = fromName(this,(func->super_Importable).super_Named.name.super_IString.str,Top);
  name.str._M_str = IVar14.str._M_str;
  name.str._M_len = (size_t)name.str._M_str;
  local_38 = cashew::ValueBuilder::makeFunction((ValueBuilder *)IVar14.str._M_len,name);
  local_40 = CONCAT71(local_40._1_7_,1);
  local_4c = iVar9;
  if ((this->options).optimizeLevel != 0 && !standaloneFunction) {
    sVar3 = std::
            _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&(this->functionsCallableFromOutside)._M_h,(key_type *)func);
    local_40 = CONCAT71(local_40._1_7_,sVar3 != 0);
  }
  sVar4 = Function::getNumParams(func);
  local_58 = this;
  if (sVar4 != 0) {
    uVar13 = 0;
    do {
      IVar2 = (Index)uVar13;
      NVar15 = Function::getLocalNameOrGeneric(func,IVar2);
      pcVar10 = (char *)0x2;
      sVar16 = (string_view)fromName(this,NVar15,Local);
      arg.str._M_len = sVar16._M_str;
      arg.str._M_str = pcVar10;
      cashew::ValueBuilder::appendArgumentToFunction
                ((ValueBuilder *)local_38.inst,(Value *)sVar16._M_len,arg);
      if ((char)local_40 != '\0') {
        TVar5 = Function::getLocalType(func,IVar2);
        local_50 = wasmToJsType(TVar5);
        bVar1 = needsJsCoercion(local_50);
        if (bVar1) {
          pRVar6 = cashew::Ref::operator[](&local_38,3);
          local_78 = pRVar6->inst;
          pvVar12 = (void *)0x18;
          this_01 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
          this_01->type = Null;
          cashew::Value::free(this_01,pvVar12);
          this_01->type = String;
          (this_01->field_1).str.str = sVar16;
          local_70.inst = cashew::SET;
          local_68 = DAT_010d1a30;
          pvVar12 = (void *)0x18;
          RVar7.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
          (RVar7.inst)->type = Null;
          cashew::Value::free(RVar7.inst,pvVar12);
          func = local_48;
          (RVar7.inst)->type = String;
          ((RVar7.inst)->field_1).str.str = sVar16;
          RVar7 = makeJsCoercion(RVar7,local_50);
          this = local_58;
          op.str._M_str = (char *)RVar7.inst;
          op.str._M_len = local_68;
          RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)this_01,local_70,op,in_R8);
          cashew::Value::push_back(local_78,RVar7);
        }
      }
      uVar13 = (ulong)(IVar2 + 1);
      sVar4 = Function::getNumParams(func);
    } while (uVar13 < sVar4);
  }
  local_2d0 = (undefined **)cashew::ValueBuilder::makeVar(false);
  pRVar6 = cashew::Ref::operator[](&local_38,3);
  if (pRVar6->inst->type == Array) {
    local_40 = (((pRVar6->inst->field_1).arr)->
               super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements;
    pRVar6 = cashew::Ref::operator[](&local_38,3);
    cashew::Value::push_back(pRVar6->inst,(Ref)local_2d0);
    RVar7.inst = local_38.inst;
    this_00 = local_58;
    value.inst = (Value *)(ulong)local_4c._0_1_;
    pFVar11 = func;
    RVar8 = processExpression(local_58,func->body,local_60,func,local_4c._0_1_);
    iVar9 = (int)pFVar11;
    flattenAppend(RVar7,RVar8);
    IVar2 = Function::getVarIndexBase(func);
    uVar13 = (ulong)IVar2;
    sVar4 = Function::getNumLocals(func);
    if (IVar2 < sVar4) {
      do {
        RVar7.inst = (Value *)local_2d0;
        IVar2 = (Index)uVar13;
        NVar15 = Function::getLocalNameOrGeneric(func,IVar2);
        IVar14 = fromName(this_00,NVar15,Local);
        name_00.str._M_len = IVar14.str._M_str;
        TVar5 = Function::getLocalType(local_48,IVar2);
        type = wasmToJsType(TVar5);
        RVar8 = makeJsCoercedZero(type);
        func = local_48;
        name_00.str._M_str = (char *)RVar8.inst;
        cashew::ValueBuilder::appendToVar
                  ((ValueBuilder *)RVar7.inst,(Value *)IVar14.str._M_len,name_00,value);
        iVar9 = (int)RVar8.inst;
        uVar13 = (ulong)(IVar2 + 1);
        sVar4 = Function::getNumLocals(func);
      } while (uVar13 < sVar4);
    }
    pRVar6 = cashew::Ref::operator[]((Ref *)&stack0xfffffffffffffd30,1);
    if (pRVar6->inst->type == Array) {
      if ((((pRVar6->inst->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
          usedElements == 0) {
        pRVar6 = cashew::Ref::operator[](&local_38,3);
        cashew::Value::splice
                  (pRVar6->inst,(int)local_40,(__off64_t *)0x1,iVar9,(__off64_t *)value.inst,in_R9,
                   in_stack_fffffffffffffd28);
      }
      return (Ref)local_38.inst;
    }
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x199,"size_t cashew::Value::size()");
}

Assistant:

Ref Wasm2JSBuilder::processFunction(Module* m,
                                    Function* func,
                                    bool standaloneFunction) {
  if (standaloneFunction) {
    // We are only printing a function, not a whole module. Prepare it for
    // translation now (if there were a module, we'd have done this for all
    // functions in parallel, earlier).
    PassRunner runner(m);
    // We only run a subset of all passes here. TODO: create a full valid module
    // for each assertion body.
    runner.add("flatten");
    runner.add("simplify-locals-notee-nostructure");
    runner.add("reorder-locals");
    runner.add("remove-unused-names");
    runner.add("vacuum");
    runner.runOnFunction(func);
  }

  // We process multiple functions from a single Wasm2JSBuilder instance, so
  // clean up the function-specific local state before each function.
  frees.clear();
  temps.clear();

  // We will be symbolically referring to all variables in the function, so make
  // sure that everything has a name and it's unique.
  Names::ensureNames(func);
  Ref ret = ValueBuilder::makeFunction(fromName(func->name, NameScope::Top));
  // arguments
  bool needCoercions = options.optimizeLevel == 0 || standaloneFunction ||
                       functionsCallableFromOutside.count(func->name);
  for (Index i = 0; i < func->getNumParams(); i++) {
    IString name = fromName(func->getLocalNameOrGeneric(i), NameScope::Local);
    ValueBuilder::appendArgumentToFunction(ret, name);
    if (needCoercions) {
      auto jsType = wasmToJsType(func->getLocalType(i));
      if (needsJsCoercion(jsType)) {
        ret[3]->push_back(ValueBuilder::makeStatement(ValueBuilder::makeBinary(
          ValueBuilder::makeName(name),
          SET,
          makeJsCoercion(ValueBuilder::makeName(name), jsType))));
      }
    }
  }
  Ref theVar = ValueBuilder::makeVar();
  size_t theVarIndex = ret[3]->size();
  ret[3]->push_back(theVar);
  // body
  flattenAppend(ret,
                processExpression(func->body, m, func, standaloneFunction));
  // vars, including new temp vars
  for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
    ValueBuilder::appendToVar(
      theVar,
      fromName(func->getLocalNameOrGeneric(i), NameScope::Local),
      makeJsCoercedZero(wasmToJsType(func->getLocalType(i))));
  }
  if (theVar[1]->size() == 0) {
    ret[3]->splice(theVarIndex, 1);
  }
  return ret;
}